

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.h
# Opt level: O3

bool absl::lts_20250127::IsUnimplemented(Status *status)

{
  ulong uVar1;
  StatusCode SVar2;
  int value;
  
  uVar1 = status->rep_;
  if ((uVar1 & 1) == 0) {
    value = *(int *)(uVar1 + 4);
  }
  else {
    value = (int)(uVar1 >> 2);
  }
  SVar2 = status_internal::MapToLocalCode(value);
  return SVar2 == kUnimplemented;
}

Assistant:

inline int Status::raw_code() const {
  if (IsInlined(rep_)) return static_cast<int>(InlinedRepToCode(rep_));
  return static_cast<int>(RepToPointer(rep_)->code());
}